

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O2

FFSVarRec_conflict LookupVarByKey(SstStream Stream,void *Key)

{
  uint uVar1;
  FFSVarRec_conflict pFVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = *Stream->ReaderMarshalData;
  uVar4 = 0;
  uVar3 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar3 = uVar4;
  }
  do {
    if (uVar3 == uVar4) {
      return (FFSVarRec_conflict)0x0;
    }
    pFVar2 = *(FFSVarRec_conflict *)(*(long *)((long)Stream->ReaderMarshalData + 8) + uVar4 * 8);
    uVar4 = uVar4 + 1;
  } while (pFVar2->Variable != Key);
  return pFVar2;
}

Assistant:

static FFSVarRec LookupVarByKey(SstStream Stream, void *Key)
{
    struct FFSReaderMarshalBase *Info = Stream->ReaderMarshalData;

    for (int i = 0; i < Info->VarCount; i++)
    {
        if (Info->VarList[i]->Variable == Key)
        {
            return Info->VarList[i];
        }
    }

    return NULL;
}